

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O3

string * __thiscall
testing::internal::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,type_info *type)

{
  int iVar1;
  char *__ptr;
  long lVar2;
  char *__s;
  undefined1 *local_78;
  string name_str;
  char *pcStack_50;
  int status;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  allocator<char> local_29;
  
  __s = *(char **)(this + 8) + (**(char **)(this + 8) == '*');
  name_str.field_2._12_4_ = 0;
  __ptr = (char *)__cxa_demangle(__s,0,0,(undefined1 *)((long)&name_str.field_2 + 0xc));
  if (name_str.field_2._12_4_ == 0) {
    __s = __ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_29);
  free(__ptr);
  pcStack_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffb0,local_78,name_str._M_dataplus._M_p + (long)local_78)
  ;
  iVar1 = std::__cxx11::string::compare((ulong)&stack0xffffffffffffffb0,0,(char *)0x7);
  if (iVar1 == 0) {
    lVar2 = std::__cxx11::string::find((char *)&stack0xffffffffffffffb0,0x2593ee,7);
    if (lVar2 != -1) {
      std::__cxx11::string::erase((ulong)&stack0xffffffffffffffb0,3);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pcStack_50 == &local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcStack_50;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  __return_storage_ptr__->_M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  if ((size_type *)local_78 != &name_str._M_string_length) {
    pcStack_50 = &local_40;
    operator_delete(local_78,name_str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetTypeName(const std::type_info& type) {
  const char* const name = type.name();
#if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, nullptr, nullptr, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return CanonicalizeForStdLibVersioning(name_str);
#else
  return name;
#endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC
}